

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemaGrammar.hpp
# Opt level: O1

XMLSize_t __thiscall
xercesc_4_0::SchemaGrammar::getElemId
          (SchemaGrammar *this,uint uriId,XMLCh *baseName,XMLCh *param_3,uint scope)

{
  SchemaElementDecl *pSVar1;
  
  pSVar1 = RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher>::getByKey
                     (this->fElemDeclPool,baseName,uriId,scope);
  if ((pSVar1 == (SchemaElementDecl *)0x0) &&
     (pSVar1 = RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher>::
               getByKey(this->fGroupElemDeclPool,baseName,uriId,scope),
     pSVar1 == (SchemaElementDecl *)0x0)) {
    return 0xfffffffe;
  }
  return (pSVar1->super_XMLElementDecl).fId;
}

Assistant:

inline XMLSize_t SchemaGrammar::getElemId (const   unsigned int  uriId
                                              , const XMLCh* const    baseName
                                              , const XMLCh* const
                                              , unsigned int          scope ) const
{
    //
    //  In this case, we don't return zero to mean 'not found', so we have to
    //  map it to the official not found value if we don't find it.
    //
    const SchemaElementDecl* decl = fElemDeclPool->getByKey(baseName, uriId, scope);
    if (!decl) {

        decl = fGroupElemDeclPool->getByKey(baseName, uriId, scope);

        if (!decl)
            return XMLElementDecl::fgInvalidElemId;
    }
    return decl->getId();
}